

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void processNode(FILE *out,xmlTextReaderPtr reader)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  int empty;
  int type;
  xmlChar *value;
  xmlChar *name;
  xmlTextReaderPtr reader_local;
  FILE *out_local;
  
  uVar1 = xmlTextReaderNodeType(reader);
  uVar2 = xmlTextReaderIsEmptyElement(reader);
  value = (xmlChar *)xmlTextReaderConstName(reader);
  if (value == (xmlChar *)0x0) {
    value = "--";
  }
  lVar5 = xmlTextReaderConstValue(reader);
  uVar3 = xmlTextReaderDepth(reader);
  uVar4 = xmlTextReaderHasValue(reader);
  fprintf((FILE *)out,"%d %d %s %d %d",(ulong)uVar3,(ulong)uVar1,value,(ulong)uVar2,uVar4);
  if (lVar5 == 0) {
    fprintf((FILE *)out,"\n");
  }
  else {
    fprintf((FILE *)out," %s\n",lVar5);
  }
  return;
}

Assistant:

static void processNode(FILE *out, xmlTextReaderPtr reader) {
    const xmlChar *name, *value;
    int type, empty;

    type = xmlTextReaderNodeType(reader);
    empty = xmlTextReaderIsEmptyElement(reader);

    name = xmlTextReaderConstName(reader);
    if (name == NULL)
	name = BAD_CAST "--";

    value = xmlTextReaderConstValue(reader);


    fprintf(out, "%d %d %s %d %d",
	    xmlTextReaderDepth(reader),
	    type,
	    name,
	    empty,
	    xmlTextReaderHasValue(reader));
    if (value == NULL)
	fprintf(out, "\n");
    else {
	fprintf(out, " %s\n", value);
    }
}